

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_buffers.cpp
# Opt level: O2

shared_ptr<polyscope::render::TextureBuffer>
polyscope::render::generateTextureBuffer<std::array<glm::vec<3,float,(glm::qualifier)0>,2ul>>
          (DeviceBufferType D,Engine *engine)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined4 in_register_0000003c;
  Engine *engine_00;
  shared_ptr<polyscope::render::TextureBuffer> sVar1;
  allocator local_31;
  string local_30;
  
  engine_00 = (Engine *)CONCAT44(in_register_0000003c,D);
  switch((ulong)engine & 0xffffffff) {
  case 0:
    std::__cxx11::string::string((string *)&local_30,"bad call",&local_31);
    exception(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    in_RDX._M_pi = extraout_RDX;
  default:
    engine_00->_vptr_Engine = (_func_int **)0x0;
    (engine_00->groundPlane).groundPlaneProgram.
    super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    break;
  case 1:
    sVar1 = generateTextureBuffer<std::array<glm::vec<3,float,(glm::qualifier)0>,2ul>,(polyscope::DeviceBufferType)1>
                      (engine_00);
    in_RDX = sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    break;
  case 2:
    sVar1 = generateTextureBuffer<std::array<glm::vec<3,float,(glm::qualifier)0>,2ul>,(polyscope::DeviceBufferType)2>
                      (engine_00);
    in_RDX = sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    break;
  case 3:
    sVar1 = generateTextureBuffer<std::array<glm::vec<3,float,(glm::qualifier)0>,2ul>,(polyscope::DeviceBufferType)3>
                      (engine_00);
    in_RDX = sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  }
  sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = in_RDX._M_pi;
  sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)engine_00;
  return (shared_ptr<polyscope::render::TextureBuffer>)
         sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TextureBuffer> generateTextureBuffer(DeviceBufferType D, Engine* engine) {
  switch (D) {
  case DeviceBufferType::Attribute:
    exception("bad call");
    break;
  case DeviceBufferType::Texture1d:
    return generateTextureBuffer<T, DeviceBufferType::Texture1d>(engine);
    break;
  case DeviceBufferType::Texture2d:
    return generateTextureBuffer<T, DeviceBufferType::Texture2d>(engine);
    break;
  case DeviceBufferType::Texture3d:
    return generateTextureBuffer<T, DeviceBufferType::Texture3d>(engine);
    break;
  }
  return nullptr;
}